

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_GIF_Image.cxx
# Opt level: O1

void __thiscall Fl_GIF_Image::Fl_GIF_Image(Fl_GIF_Image *this,char *infname)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  FILE *__stream;
  size_t sVar11;
  char *pcVar12;
  char **ppcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  byte *pbVar17;
  byte bVar18;
  byte bVar19;
  char cVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  int iVar30;
  byte bVar31;
  uchar Blue [256];
  uchar Green [256];
  uchar Red [256];
  uchar remap [256];
  uchar used [256];
  short Prefix [4096];
  uchar Suffix [4096];
  uint local_38ec;
  ulong local_38e8;
  uint local_38e0;
  uint local_38d4;
  size_t local_38c8;
  char *local_38b0;
  uint local_387c;
  byte local_3848 [256];
  byte local_3748 [256];
  byte local_3648 [256];
  byte abStack_3548 [256];
  char local_3448 [1040];
  undefined2 local_3038;
  char local_3036;
  char local_3035;
  char local_3034;
  char local_3033;
  char local_1038 [4104];
  
  Fl_Pixmap::Fl_Pixmap(&this->super_Fl_Pixmap,(char **)0x0);
  (this->super_Fl_Pixmap).super_Fl_Image._vptr_Fl_Image = (_func_int **)&PTR__Fl_Pixmap_0027baa8;
  __stream = (FILE *)fl_fopen(infname,"rb");
  if (__stream == (FILE *)0x0) {
    (*Fl::error)("Fl_GIF_Image: Unable to open %s!",infname);
    (this->super_Fl_Pixmap).super_Fl_Image.ld_ = -2;
  }
  else {
    sVar11 = fread(&local_3038,1,6,__stream);
    if (sVar11 < 6) {
      fclose(__stream);
      iVar21 = -2;
    }
    else {
      if ((((char)local_3038 == 'G') && (local_3038._1_1_ == 'I')) && (local_3036 == 'F')) {
        if ((local_3033 != 'a' || local_3035 != '8') || '9' < local_3034) {
          (*Fl::warning)("%s is version %c%c%c.",infname,(ulong)(uint)(int)local_3035,
                         (ulong)(uint)(int)local_3034,(ulong)(uint)(int)local_3033);
        }
        uVar6 = getc(__stream);
        uVar7 = getc(__stream);
        uVar8 = getc(__stream);
        uVar9 = getc(__stream);
        uVar10 = getc(__stream);
        bVar18 = (byte)uVar10 & 7;
        local_38b0._0_4_ = uVar10 & 7;
        uVar28 = 2 << bVar18;
        uVar23 = (ulong)uVar28;
        getc(__stream);
        getc(__stream);
        if ((char)(byte)uVar10 < '\0') {
          uVar29 = (ulong)(uint)(0 << bVar18);
          do {
            iVar21 = getc(__stream);
            local_3648[uVar29] = (byte)iVar21;
            iVar21 = getc(__stream);
            local_3748[uVar29] = (byte)iVar21;
            iVar21 = getc(__stream);
            local_3848[uVar29] = (byte)iVar21;
            uVar29 = uVar29 + 1;
          } while (uVar23 != uVar29);
        }
        else {
          iVar21 = 0;
          (*Fl::warning)("%s does not have a colormap.",infname);
          uVar24 = 0;
          do {
            bVar18 = (byte)(iVar21 / (int)(uVar28 - 1));
            local_3848[uVar24] = bVar18;
            local_3748[uVar24] = bVar18;
            local_3648[uVar24] = bVar18;
            uVar24 = uVar24 + 1;
            iVar21 = iVar21 + 0xff;
            uVar29 = uVar23;
          } while (uVar23 != uVar24);
        }
        local_38c8 = (size_t)((uVar7 & 0xff) << 8 | uVar6 & 0xff);
        local_38e8 = (ulong)((uVar9 & 0xff) << 8 | uVar8 & 0xff);
        bVar4 = false;
        bVar18 = 0xff;
        local_387c = 0;
        do {
          uVar6 = getc(__stream);
          if ((char)uVar6 == ',') {
            getc(__stream);
            getc(__stream);
            getc(__stream);
            getc(__stream);
            uVar6 = getc(__stream);
            uVar7 = getc(__stream);
            uVar8 = getc(__stream);
            uVar9 = getc(__stream);
            iVar21 = getc(__stream);
            bVar18 = (byte)iVar21;
            if ((char)bVar18 < '\0') {
              uVar29 = 0;
              do {
                iVar21 = getc(__stream);
                local_3648[uVar29] = (byte)iVar21;
                iVar21 = getc(__stream);
                local_3748[uVar29] = (byte)iVar21;
                iVar21 = getc(__stream);
                local_3848[uVar29] = (byte)iVar21;
                uVar29 = uVar29 + 1;
              } while ((uint)(2 << (bVar18 & 7)) != uVar29);
            }
            local_38c8 = (size_t)((uVar7 & 0xff) << 8 | uVar6 & 0xff);
            local_38e8 = (ulong)((uVar9 & 0xff) << 8 | uVar8 & 0xff);
            bVar18 = bVar18 >> 6 & 1;
            uVar6 = getc(__stream);
            uVar29 = (ulong)((uVar6 & 0xff) + 1);
            bVar2 = false;
          }
          else {
            if ((uVar6 & 0xff) == 0x21) {
              uVar6 = getc(__stream);
              uVar7 = getc(__stream);
              uVar7 = uVar7 & 0xff;
              if (uVar7 == 4 && (uVar6 & 0xff) == 0xf9) {
                uVar6 = getc(__stream);
                getc(__stream);
                getc(__stream);
                local_387c = getc(__stream);
                if ((uVar6 & 1) != 0) {
                  bVar4 = true;
                }
                uVar7 = getc(__stream);
                uVar7 = uVar7 & 0xff;
              }
              else if ((uVar6 | 0xffffff00) < 0xfffffffe) {
                (*Fl::warning)("%s: unknown gif extension 0x%02x.",infname);
              }
            }
            else {
              uVar7 = 0;
              (*Fl::warning)("%s: unknown gif code 0x%02x",infname,(ulong)(uVar6 & 0xff));
            }
            bVar2 = true;
            for (; uVar7 != 0; uVar7 = uVar7 & 0xff) {
              do {
                getc(__stream);
                uVar7 = uVar7 - 1;
              } while (uVar7 != 0);
              uVar7 = getc(__stream);
            }
          }
        } while (bVar2);
        uVar6 = 1 << ((byte)uVar29 - 1 & 0x1f);
        if ((int)uVar29 <= (int)((uint)local_38b0 + 1)) {
          uVar23 = (ulong)uVar6;
        }
        iVar30 = (int)local_38c8;
        iVar22 = (int)local_38e8;
        uVar25 = (ulong)(uint)(iVar30 * iVar22);
        pcVar12 = (char *)operator_new__(uVar25);
        local_38b0 = pcVar12 + local_38c8;
        uVar10 = ~(-1 << ((byte)uVar29 & 0x1f));
        uVar7 = getc(__stream);
        uVar8 = getc(__stream);
        uVar9 = (uVar7 & 0xff) - 1;
        uVar24 = uVar29 & 0xffffffff;
        iVar21 = 0;
        local_38e0 = 0;
        bVar31 = 0;
        iVar27 = 0;
        pcVar14 = pcVar12;
        local_38ec = uVar6;
        local_38d4 = uVar10;
        uVar7 = uVar6 + 2;
        do {
          uVar28 = uVar8 & 0xff;
          iVar3 = (int)uVar24;
          iVar26 = iVar27 + iVar3;
          if (iVar26 < 8) {
LAB_0020d5fe:
            if (0xf < iVar26) {
              if ((int)uVar9 < 1) {
                uVar9 = getc(__stream);
                uVar9 = uVar9 & 0xff;
                if (uVar9 == 0) goto LAB_0020d81c;
              }
              uVar8 = getc(__stream);
              uVar9 = uVar9 - 1;
              uVar28 = uVar28 | (uVar8 & 0xff) << 0x10;
            }
            uVar28 = uVar28 >> ((byte)iVar27 & 0x1f) & local_38d4;
            iVar27 = iVar26 % 8;
            if (uVar28 == uVar6) {
              bVar2 = false;
              uVar24 = uVar29 & 0xffffffff;
              local_38ec = uVar6;
              local_38d4 = uVar10;
              uVar7 = uVar6 + 2;
            }
            else {
              bVar2 = true;
              if (uVar28 != uVar6 + 1) {
                pcVar16 = local_3448;
                uVar5 = uVar28;
                if ((int)uVar7 <= (int)uVar28) {
                  if (uVar28 != uVar7) {
                    (*Fl::error)("Fl_GIF_Image: %s - LZW Barf!",infname);
                    bVar2 = true;
                    goto LAB_0020d8c6;
                  }
                  local_3448[0] = (char)local_38e0;
                  pcVar16 = local_3448 + 1;
                  uVar5 = local_38ec;
                }
                while (local_38e0 = uVar5, (int)uVar23 <= (int)local_38e0) {
                  *pcVar16 = local_1038[local_38e0];
                  pcVar16 = pcVar16 + 1;
                  uVar5 = (int)(short)(&local_3038)[local_38e0];
                }
                *pcVar16 = (char)local_38e0;
                pcVar16 = pcVar16 + 1;
                do {
                  *pcVar14 = pcVar16[-1];
                  pcVar14 = pcVar14 + 1;
                  if (local_38b0 <= pcVar14) {
                    if (bVar18 == 0) {
                      iVar21 = iVar21 + 1;
                    }
                    else {
                      switch(bVar31) {
                      case 0:
                        iVar21 = iVar21 + 8;
                        bVar31 = iVar22 <= iVar21;
                        if (iVar22 <= iVar21) {
                          iVar21 = 4;
                        }
                        break;
                      case 1:
                        iVar26 = iVar21 + 8;
                        iVar21 = iVar26;
                        if (iVar22 <= iVar26) {
                          iVar21 = 2;
                        }
                        bVar31 = (iVar22 <= iVar26) + 1;
                        break;
                      case 2:
                        iVar21 = iVar21 + 4;
                        bVar2 = iVar21 < iVar22;
                        if (iVar22 <= iVar21) {
                          iVar21 = 1;
                        }
                        bVar31 = bVar2 ^ 3;
                        break;
                      case 3:
                        iVar21 = iVar21 + 2;
                        bVar31 = 3;
                      }
                    }
                    if (iVar22 <= iVar21) {
                      iVar21 = 0;
                    }
                    pcVar14 = pcVar12 + iVar21 * iVar30;
                    local_38b0 = pcVar14 + local_38c8;
                  }
                  pcVar16 = pcVar16 + -1;
                } while (local_3448 < pcVar16);
                if (local_38ec == uVar6) {
                  bVar2 = false;
                  local_38ec = uVar28;
                }
                else {
                  (&local_3038)[(int)uVar7] = (short)local_38ec;
                  local_1038[(int)uVar7] = (char)local_38e0;
                  uVar5 = uVar7 + 1;
                  if (((int)local_38d4 <= (int)uVar7) && (uVar5 = uVar7, iVar3 < 0xc)) {
                    bVar19 = (byte)uVar24;
                    uVar24 = (ulong)(iVar3 + 1);
                    local_38d4 = (2 << (bVar19 & 0x1f)) - 1;
                    uVar5 = uVar7 + 1;
                  }
                  bVar2 = false;
                  local_38ec = uVar28;
                  uVar7 = uVar5;
                }
              }
            }
          }
          else {
            if (0 < (int)uVar9) {
LAB_0020d5df:
              uVar8 = getc(__stream);
              uVar9 = uVar9 - 1;
              uVar28 = uVar28 | (uVar8 & 0xff) << 8;
              goto LAB_0020d5fe;
            }
            uVar9 = getc(__stream);
            uVar9 = uVar9 & 0xff;
            if (uVar9 != 0) goto LAB_0020d5df;
LAB_0020d81c:
            uVar9 = 0;
            bVar2 = true;
          }
LAB_0020d8c6:
        } while (!bVar2);
        (this->super_Fl_Pixmap).super_Fl_Image.w_ = iVar30;
        (this->super_Fl_Pixmap).super_Fl_Image.h_ = iVar22;
        (this->super_Fl_Pixmap).super_Fl_Image.d_ = 1;
        ppcVar13 = (char **)operator_new__(local_38e8 * 8 + 0x10);
        bVar31 = local_3648[0];
        bVar18 = local_3748[0];
        cVar1 = (char)local_387c;
        if ((bVar4) && (cVar1 != '\0')) {
          if (uVar25 != 0) {
            pcVar14 = pcVar12 + uVar25;
            do {
              pcVar16 = pcVar14 + -1;
              pcVar14 = pcVar14 + -1;
              if (*pcVar16 == cVar1) {
                cVar20 = '\0';
LAB_0020d947:
                *pcVar14 = cVar20;
              }
              else {
                cVar20 = cVar1;
                if (*pcVar16 == '\0') goto LAB_0020d947;
              }
            } while (pcVar12 < pcVar14);
          }
          local_387c = local_387c & 0xff;
          local_3648[0] = local_3648[local_387c];
          local_3648[local_387c] = bVar31;
          local_3748[0] = local_3748[local_387c];
          local_3748[local_387c] = bVar18;
          bVar18 = local_3848[local_387c];
          local_3848[local_387c] = local_3848[0];
          local_3848[0] = bVar18;
        }
        iVar21 = 0;
        memset(local_3448,0,uVar23);
        pcVar14 = pcVar12 + uVar25;
        pcVar16 = pcVar14;
        if (uVar25 != 0) {
          do {
            pcVar15 = pcVar16 + -1;
            local_3448[(byte)pcVar16[-1]] = '\x01';
            pcVar16 = pcVar15;
          } while (pcVar12 < pcVar15);
        }
        bVar18 = (local_3448[0] != '\0' && bVar4) ^ 0x21;
        sVar11 = 0;
        do {
          if (local_3448[sVar11] != '\0') {
            abStack_3548[sVar11] = bVar18;
            bVar18 = bVar18 + 1;
            iVar21 = iVar21 + 1;
          }
          sVar11 = sVar11 + 1;
        } while (uVar23 != sVar11);
        iVar27 = sprintf(local_1038,"%d %d %d %d",local_38c8,local_38e8,(ulong)(uint)-iVar21,1);
        pcVar16 = (char *)operator_new__((long)(iVar27 + 1));
        *ppcVar13 = pcVar16;
        strcpy(pcVar16,local_1038);
        pbVar17 = (byte *)operator_new__((long)(iVar21 << 2));
        ppcVar13[1] = (char *)pbVar17;
        sVar11 = 0;
        do {
          if (local_3448[sVar11] != '\0') {
            *pbVar17 = abStack_3548[sVar11];
            pbVar17[1] = local_3648[sVar11];
            pbVar17[2] = local_3748[sVar11];
            pbVar17[3] = local_3848[sVar11];
            pbVar17 = pbVar17 + 4;
          }
          sVar11 = sVar11 + 1;
        } while (uVar23 != sVar11);
        if (uVar25 != 0) {
          do {
            pcVar14[-1] = abStack_3548[(byte)pcVar14[-1]];
            pcVar14 = pcVar14 + -1;
          } while (pcVar12 < pcVar14);
        }
        if (iVar22 != 0) {
          uVar23 = 0;
          pcVar14 = pcVar12;
          do {
            pcVar16 = (char *)operator_new__((ulong)(iVar30 + 1));
            ppcVar13[uVar23 + 2] = pcVar16;
            memcpy(pcVar16,pcVar14,local_38c8);
            pcVar16[local_38c8] = '\0';
            uVar23 = uVar23 + 1;
            pcVar14 = pcVar14 + local_38c8;
          } while (local_38e8 != uVar23);
        }
        (this->super_Fl_Pixmap).super_Fl_Image.data_ = ppcVar13;
        (this->super_Fl_Pixmap).super_Fl_Image.count_ = iVar22 + 2;
        (this->super_Fl_Pixmap).alloc_data = 1;
        operator_delete__(pcVar12);
        fclose(__stream);
        return;
      }
      fclose(__stream);
      iVar21 = -3;
      (*Fl::error)("Fl_GIF_Image: %s is not a GIF file.\n",infname);
    }
    (this->super_Fl_Pixmap).super_Fl_Image.ld_ = iVar21;
  }
  return;
}

Assistant:

Fl_GIF_Image::Fl_GIF_Image(const char *infname) : Fl_Pixmap((char *const*)0) {
  FILE *GifFile;	// File to read
  char **new_data;	// Data array

  if ((GifFile = fl_fopen(infname, "rb")) == NULL) {
    Fl::error("Fl_GIF_Image: Unable to open %s!", infname);
    ld(ERR_FILE_ACCESS);
    return;
  }

  {char b[6];
  if (fread(b,1,6,GifFile)<6) {
    fclose(GifFile);
    ld(ERR_FILE_ACCESS);
    return; /* quit on eof */
  }
  if (b[0]!='G' || b[1]!='I' || b[2] != 'F') {
    fclose(GifFile);
    Fl::error("Fl_GIF_Image: %s is not a GIF file.\n", infname);
    ld(ERR_FORMAT);
    return;
  }
  if (b[3]!='8' || b[4]>'9' || b[5]!= 'a')
    Fl::warning("%s is version %c%c%c.",infname,b[3],b[4],b[5]);
  }

  int Width; GETSHORT(Width);
  int Height; GETSHORT(Height);

  uchar ch = NEXTBYTE;
  char HasColormap = ((ch & 0x80) != 0);
  int BitsPerPixel = (ch & 7) + 1;
  int ColorMapSize = 1 << BitsPerPixel;
  // int OriginalResolution = ((ch>>4)&7)+1;
  // int SortedTable = (ch&8)!=0;
  ch = NEXTBYTE; // Background Color index
  ch = NEXTBYTE; // Aspect ratio is N/64

  // Read in global colormap:
  uchar transparent_pixel = 0;
  char has_transparent = 0;
  uchar Red[256], Green[256], Blue[256]; /* color map */
  if (HasColormap) {
    for (int i=0; i < ColorMapSize; i++) {	
      Red[i] = NEXTBYTE;
      Green[i] = NEXTBYTE;
      Blue[i] = NEXTBYTE;
    }
  } else {
    Fl::warning("%s does not have a colormap.", infname);
    for (int i = 0; i < ColorMapSize; i++)
      Red[i] = Green[i] = Blue[i] = (uchar)(255 * i / (ColorMapSize-1));
  }

  int CodeSize;		/* Code size, init from GIF header, increases... */
  char Interlace;

  for (;;) {

    int i = NEXTBYTE;
    if (i<0) {
      fclose(GifFile);
      Fl::error("Fl_GIF_Image: %s - unexpected EOF",infname); 
      w(0); h(0); d(0); ld(ERR_FORMAT);
      return;
    }
    int blocklen;

    //  if (i == 0x3B) return 0;  eof code

    if (i == 0x21) {		// a "gif extension"

      ch = NEXTBYTE;
      blocklen = NEXTBYTE;

      if (ch==0xF9 && blocklen==4) { // Netscape animation extension

	char bits;
	bits = NEXTBYTE;
	getc(GifFile); getc(GifFile); // GETSHORT(delay);
	transparent_pixel = NEXTBYTE;
	if (bits & 1) has_transparent = 1;
	blocklen = NEXTBYTE;

      } else if (ch == 0xFF) { // Netscape repeat count
	;

      } else if (ch != 0xFE) { //Gif Comment
	Fl::warning("%s: unknown gif extension 0x%02x.", infname, ch);
      }
    } else if (i == 0x2c) {	// an image

      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(x_position);
      ch = NEXTBYTE; ch = NEXTBYTE; // GETSHORT(y_position);
      GETSHORT(Width);
      GETSHORT(Height);
      ch = NEXTBYTE;
      Interlace = ((ch & 0x40) != 0);
      if (ch&0x80) { 
	// read local color map
	int n = 2<<(ch&7);
	for (i=0; i < n; i++) {	
	  Red[i] = NEXTBYTE;
	  Green[i] = NEXTBYTE;
	  Blue[i] = NEXTBYTE;
	}
      }
      CodeSize = NEXTBYTE+1;
      break; // okay, this is the image we want
    } else {
      Fl::warning("%s: unknown gif code 0x%02x", infname, i);
      blocklen = 0;
    }

    // skip the data:
    while (blocklen>0) {while (blocklen--) {ch = NEXTBYTE;} blocklen=NEXTBYTE;}
  }

  if (BitsPerPixel >= CodeSize)
  {
    // Workaround for broken GIF files...
    BitsPerPixel = CodeSize - 1;
    ColorMapSize = 1 << BitsPerPixel;
  }

  uchar *Image = new uchar[Width*Height];

  int YC = 0, Pass = 0; /* Used to de-interlace the picture */
  uchar *p = Image;
  uchar *eol = p+Width;

  int InitCodeSize = CodeSize;
  int ClearCode = (1 << (CodeSize-1));
  int EOFCode = ClearCode + 1;
  int FirstFree = ClearCode + 2;
  int FinChar = 0;
  int ReadMask = (1<<CodeSize) - 1;
  int FreeCode = FirstFree;
  int OldCode = ClearCode;

  // tables used by LZW decompresser:
  short int Prefix[4096];
  uchar Suffix[4096];

  int blocklen = NEXTBYTE;
  uchar thisbyte = NEXTBYTE; blocklen--;
  int frombit = 0;

  for (;;) {

/* Fetch the next code from the raster data stream.  The codes can be
 * any length from 3 to 12 bits, packed into 8-bit bytes, so we have to
 * maintain our location as a pointer and a bit offset.
 * In addition, gif adds totally useless and annoying block counts
 * that must be correctly skipped over. */
    int CurCode = thisbyte;
    if (frombit+CodeSize > 7) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<8;
    }
    if (frombit+CodeSize > 15) {
      if (blocklen <= 0) {
	blocklen = NEXTBYTE;
	if (blocklen <= 0) break;
      }
      thisbyte = NEXTBYTE; blocklen--;
      CurCode |= thisbyte<<16;
    }
    CurCode = (CurCode>>frombit)&ReadMask;
    frombit = (frombit+CodeSize)%8;

    if (CurCode == ClearCode) {
      CodeSize = InitCodeSize;
      ReadMask = (1<<CodeSize) - 1;
      FreeCode = FirstFree;
      OldCode = ClearCode;
      continue;
    }

    if (CurCode == EOFCode) break;

    uchar OutCode[1025]; // temporary array for reversing codes
    uchar *tp = OutCode;
    int i;
    if (CurCode < FreeCode) i = CurCode;
    else if (CurCode == FreeCode) {*tp++ = (uchar)FinChar; i = OldCode;}
    else {Fl::error("Fl_GIF_Image: %s - LZW Barf!", infname); break;}

    while (i >= ColorMapSize) {*tp++ = Suffix[i]; i = Prefix[i];}
    *tp++ = FinChar = i;
    do {
      *p++ = *--tp;
      if (p >= eol) {
	if (!Interlace) YC++;
	else switch (Pass) {
	case 0: YC += 8; if (YC >= Height) {Pass++; YC = 4;} break;
	case 1: YC += 8; if (YC >= Height) {Pass++; YC = 2;} break;
	case 2: YC += 4; if (YC >= Height) {Pass++; YC = 1;} break;
	case 3: YC += 2; break;
	}
	if (YC>=Height) YC=0; /* cheap bug fix when excess data */
	p = Image + YC*Width;
	eol = p+Width;
      }
    } while (tp > OutCode);

    if (OldCode != ClearCode) {
      Prefix[FreeCode] = (short)OldCode;
      Suffix[FreeCode] = FinChar;
      FreeCode++;
      if (FreeCode > ReadMask) {
	if (CodeSize < 12) {
	  CodeSize++;
	  ReadMask = (1 << CodeSize) - 1;
	}
	else FreeCode--;
      }
    }
    OldCode = CurCode;
  }

  // We are done reading the file, now convert to xpm:

  // allocate line pointer arrays:
  w(Width);
  h(Height);
  d(1);
  new_data = new char*[Height+2];

  // transparent pixel must be zero, swap if it isn't:
  if (has_transparent && transparent_pixel != 0) {
    // swap transparent pixel with zero
    p = Image+Width*Height;
    while (p-- > Image) {
      if (*p==transparent_pixel) *p = 0;
      else if (!*p) *p = transparent_pixel;
    }
    uchar t;
    t                        = Red[0];
    Red[0]                   = Red[transparent_pixel];
    Red[transparent_pixel]   = t;

    t                        = Green[0];
    Green[0]                 = Green[transparent_pixel];
    Green[transparent_pixel] = t;

    t                        = Blue[0];
    Blue[0]                  = Blue[transparent_pixel];
    Blue[transparent_pixel]  = t;
  }

  // find out what colors are actually used:
  uchar used[256]; uchar remap[256];
  int i;
  for (i = 0; i < ColorMapSize; i++) used[i] = 0;
  p = Image+Width*Height;
  while (p-- > Image) used[*p] = 1;

  // remap them to start with printing characters:
  int base = has_transparent && used[0] ? ' ' : ' '+1;
  int numcolors = 0;
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    remap[i] = (uchar)(base++);
    numcolors++;
  }

  // write the first line of xpm data (use suffix as temp array):
  int length = sprintf((char*)(Suffix),
		       "%d %d %d %d",Width,Height,-numcolors,1);
  new_data[0] = new char[length+1];
  strcpy(new_data[0], (char*)Suffix);

  // write the colormap
  new_data[1] = (char*)(p = new uchar[4*numcolors]);
  for (i = 0; i < ColorMapSize; i++) if (used[i]) {
    *p++ = remap[i];
    *p++ = Red[i];
    *p++ = Green[i];
    *p++ = Blue[i];
  }

  // remap the image data:
  p = Image+Width*Height;
  while (p-- > Image) *p = remap[*p];

  // split the image data into lines:
  for (i=0; i<Height; i++) {
    new_data[i+2] = new char[Width+1];
    memcpy(new_data[i + 2], (char*)(Image + i*Width), Width);
    new_data[i + 2][Width] = 0;
  }

  data((const char **)new_data, Height + 2);
  alloc_data = 1;

  delete[] Image;

  fclose(GifFile);
}